

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O0

int Eigen::internal::garbage_collection<int>
              (int n_row,int n_col,Colamd_Row<int> *Row,colamd_col<int> *Col,int *A,int *pfree)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int local_4c;
  int length;
  int c;
  int r;
  int j;
  int *pdest;
  int *psrc;
  int *pfree_local;
  int *A_local;
  colamd_col<int> *Col_local;
  Colamd_Row<int> *Row_local;
  int n_col_local;
  int n_row_local;
  
  _r = A;
  for (local_4c = 0; local_4c < n_col; local_4c = local_4c + 1) {
    if (-1 < Col[local_4c].start) {
      iVar1 = Col[local_4c].start;
      Col[local_4c].start = (int)((long)_r - (long)A >> 2);
      iVar3 = Col[local_4c].length;
      pdest = A + iVar1;
      for (c = 0; c < iVar3; c = c + 1) {
        if (-1 < Row[*pdest].shared2.mark) {
          *_r = *pdest;
          _r = _r + 1;
        }
        pdest = pdest + 1;
      }
      Col[local_4c].length = (int)((long)_r - (long)(A + Col[local_4c].start) >> 2);
    }
  }
  for (length = 0; length < n_row; length = length + 1) {
    if (-1 < Row[length].shared2.mark) {
      if (Row[length].length == 0) {
        Row[length].shared2.mark = -1;
      }
      else {
        iVar1 = Row[length].start;
        Row[length].shared2.mark = A[iVar1];
        A[iVar1] = -1 - length;
      }
    }
  }
  pdest = _r;
  piVar2 = pdest;
  while (pdest = piVar2, pdest < pfree) {
    piVar2 = pdest + 1;
    if (*pdest < 0) {
      iVar3 = -1 - *pdest;
      *pdest = (int)Row[iVar3].shared2;
      Row[iVar3].start = (int)((long)_r - (long)A >> 2);
      iVar1 = Row[iVar3].length;
      for (c = 0; c < iVar1; c = c + 1) {
        if (-1 < Col[*pdest].start) {
          *_r = *pdest;
          _r = _r + 1;
        }
        pdest = pdest + 1;
      }
      Row[iVar3].length = (int)((long)_r - (long)(A + Row[iVar3].start) >> 2);
      piVar2 = pdest;
    }
  }
  return (int)((long)_r - (long)A >> 2);
}

Assistant:

static Index garbage_collection  /* returns the new value of pfree */
  (
    /* === Parameters ======================================================= */
    
    Index n_row,      /* number of rows */
    Index n_col,      /* number of columns */
    Colamd_Row<Index> Row [],    /* row info */
    colamd_col<Index> Col [],    /* column info */
    Index A [],     /* A [0 ... Alen-1] holds the matrix */
    Index *pfree      /* &A [0] ... pfree is in use */
    )
{
  /* === Local variables ================================================== */

  Index *psrc ;     /* source pointer */
  Index *pdest ;    /* destination pointer */
  Index j ;     /* counter */
  Index r ;     /* a row index */
  Index c ;     /* a column index */
  Index length ;    /* length of a row or column */

  /* === Defragment the columns =========================================== */

  pdest = &A[0] ;
  for (c = 0 ; c < n_col ; c++)
  {
    if (COL_IS_ALIVE (c))
    {
      psrc = &A [Col [c].start] ;

      /* move and compact the column */
      COLAMD_ASSERT (pdest <= psrc) ;
      Col [c].start = (Index) (pdest - &A [0]) ;
      length = Col [c].length ;
      for (j = 0 ; j < length ; j++)
      {
	r = *psrc++ ;
	if (ROW_IS_ALIVE (r))
	{
	  *pdest++ = r ;
	}
      }
      Col [c].length = (Index) (pdest - &A [Col [c].start]) ;
    }
  }

  /* === Prepare to defragment the rows =================================== */

  for (r = 0 ; r < n_row ; r++)
  {
    if (ROW_IS_ALIVE (r))
    {
      if (Row [r].length == 0)
      {
	/* this row is of zero length.  cannot compact it, so kill it */
	COLAMD_DEBUG3 (("Defrag row kill\n")) ;
	KILL_ROW (r) ;
      }
      else
      {
	/* save first column index in Row [r].shared2.first_column */
	psrc = &A [Row [r].start] ;
	Row [r].shared2.first_column = *psrc ;
	COLAMD_ASSERT (ROW_IS_ALIVE (r)) ;
	/* flag the start of the row with the one's complement of row */
	*psrc = ONES_COMPLEMENT (r) ;

      }
    }
  }

  /* === Defragment the rows ============================================== */

  psrc = pdest ;
  while (psrc < pfree)
  {
    /* find a negative number ... the start of a row */
    if (*psrc++ < 0)
    {
      psrc-- ;
      /* get the row index */
      r = ONES_COMPLEMENT (*psrc) ;
      COLAMD_ASSERT (r >= 0 && r < n_row) ;
      /* restore first column index */
      *psrc = Row [r].shared2.first_column ;
      COLAMD_ASSERT (ROW_IS_ALIVE (r)) ;

      /* move and compact the row */
      COLAMD_ASSERT (pdest <= psrc) ;
      Row [r].start = (Index) (pdest - &A [0]) ;
      length = Row [r].length ;
      for (j = 0 ; j < length ; j++)
      {
	c = *psrc++ ;
	if (COL_IS_ALIVE (c))
	{
	  *pdest++ = c ;
	}
      }
      Row [r].length = (Index) (pdest - &A [Row [r].start]) ;

    }
  }
  /* ensure we found all the rows */
  COLAMD_ASSERT (debug_rows == 0) ;

  /* === Return the new value of pfree ==================================== */

  return ((Index) (pdest - &A [0])) ;
}